

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::objectivec::Options::Options(Options *this)

{
  char *pcVar1;
  undefined1 in_R9B;
  StringPiece full;
  StringPiece local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  (this->expected_prefixes_path)._M_dataplus._M_p = (pointer)&(this->expected_prefixes_path).field_2
  ;
  (this->expected_prefixes_path)._M_string_length = 0;
  (this->expected_prefixes_path).field_2._M_local_buf[0] = '\0';
  (this->expected_prefixes_suppressions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expected_prefixes_suppressions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expected_prefixes_suppressions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->generate_for_named_framework)._M_dataplus._M_p =
       (pointer)&(this->generate_for_named_framework).field_2;
  (this->generate_for_named_framework)._M_string_length = 0;
  (this->generate_for_named_framework).field_2._M_local_buf[0] = '\0';
  (this->named_framework_to_proto_path_mappings_path)._M_dataplus._M_p =
       (pointer)&(this->named_framework_to_proto_path_mappings_path).field_2;
  (this->named_framework_to_proto_path_mappings_path)._M_string_length = 0;
  (this->named_framework_to_proto_path_mappings_path).field_2._M_local_buf[0] = '\0';
  (this->runtime_import_prefix)._M_dataplus._M_p = (pointer)&(this->runtime_import_prefix).field_2;
  (this->runtime_import_prefix)._M_string_length = 0;
  (this->runtime_import_prefix).field_2._M_local_buf[0] = '\0';
  pcVar1 = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES");
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)this);
  }
  pcVar1 = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES_SUPPRESSIONS");
  if (pcVar1 != (char *)0x0) {
    stringpiece_internal::StringPiece::StringPiece(&local_50,pcVar1);
    full.length_ = (size_type)";";
    full.ptr_ = (char *)local_50.length_;
    Split_abi_cxx11_(&local_40,(protobuf *)local_50.ptr_,full,(char *)0x1,(bool)in_R9B);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&this->expected_prefixes_suppressions,&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
  }
  this->prefixes_must_be_registered = false;
  this->require_prefixes = false;
  return;
}

Assistant:

Options::Options() {
  // Default is the value of the env for the package prefixes.
  const char* file_path = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES");
  if (file_path) {
    expected_prefixes_path = file_path;
  }
  const char* suppressions = getenv("GPB_OBJC_EXPECTED_PACKAGE_PREFIXES_SUPPRESSIONS");
  if (suppressions) {
    expected_prefixes_suppressions =
        Split(suppressions, ";", true);
  }
  prefixes_must_be_registered = false;
  require_prefixes = false;
}